

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_file_sink-inl.h
# Opt level: O1

int __thiscall
spdlog::sinks::basic_file_sink<std::mutex>::truncate
          (basic_file_sink<std::mutex> *this,char *__file,__off_t __length)

{
  mutex *__mutex;
  int iVar1;
  
  __mutex = &(this->super_base_sink<std::mutex>).mutex_;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    details::file_helper::reopen(&this->file_helper_,true);
    iVar1 = pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return iVar1;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

SPDLOG_INLINE void basic_file_sink<Mutex>::truncate() {
    std::lock_guard<Mutex> lock(base_sink<Mutex>::mutex_);
    file_helper_.reopen(true);
}